

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bruteforce.hpp
# Opt level: O3

PointSet * __thiscall
hnsw::BruteForceIndex::Search
          (PointSet *__return_storage_ptr__,BruteForceIndex *this,uint32_t K,float *query)

{
  pointer *pppVar1;
  iterator __position;
  pair<unsigned_int,_float> *__args;
  float fVar2;
  float dist;
  MaxPointHeap result;
  uint local_60;
  float local_5c;
  priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointLessComparator>
  local_58;
  
  fVar2 = 0.0;
  local_58.c.
  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60 = 0;
  local_58.c.
  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  local_58.c.
  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
  local_58.c.
  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_58.c.
  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  if (this->num_points_ != 0) {
    do {
      (**this->distance_->_vptr_Distance)
                (this->distance_,query,
                 (this->points_).row_ptrs_.
                 super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
                 super__Vector_impl_data._M_start[local_60]);
      local_5c = fVar2;
      std::
      priority_queue<std::pair<unsigned_int,float>,std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,hnsw::PointLessComparator>
      ::emplace<unsigned_int&,float&>
                ((priority_queue<std::pair<unsigned_int,float>,std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,hnsw::PointLessComparator>
                  *)&local_58,&local_60,&local_5c);
      if ((ulong)K <
          (ulong)(CONCAT44(local_58.c.
                           super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                           local_58.c.
                           super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish._0_4_) -
                  CONCAT44(local_58.c.
                           super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                           local_58.c.
                           super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._0_4_) >> 3)) {
        std::
        priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointLessComparator>
        ::pop(&local_58);
      }
      local_60 = local_60 + 1;
    } while (local_60 < this->num_points_);
  }
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  while (__args = (pair<unsigned_int,_float> *)
                  CONCAT44(local_58.c.
                           super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                           local_58.c.
                           super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._0_4_),
        __args != (pair<unsigned_int,_float> *)
                  CONCAT44(local_58.c.
                           super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                           local_58.c.
                           super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish._0_4_)) {
    __position._M_current =
         (__return_storage_ptr__->
         super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>::
      _M_realloc_insert<std::pair<unsigned_int,float>const&>
                ((vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                  *)__return_storage_ptr__,__position,__args);
    }
    else {
      *__position._M_current = *__args;
      pppVar1 = &(__return_storage_ptr__->
                 super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *pppVar1 = *pppVar1 + 1;
    }
    std::
    priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointLessComparator>
    ::pop(&local_58);
  }
  if (__args != (pair<unsigned_int,_float> *)0x0) {
    operator_delete(__args);
  }
  return __return_storage_ptr__;
}

Assistant:

PointSet Search(uint32_t K, const float *query) {
    MaxPointHeap result;
    for (uint32_t i = 0; i < num_points_; i++) {
      float dist = distance_(query, points_[i]);
      result.emplace(i, dist);
      if (result.size() > K) {
        result.pop();
      }
    }

    PointSet neighbors;
    while (!result.empty()) {
      neighbors.push_back(result.top());
      result.pop();
    }
    return neighbors;
  }